

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void __thiscall
icu_63::CharacterNode::addValue
          (CharacterNode *this,void *value,UObjectDeleter *valueDeleter,UErrorCode *status)

{
  UBool UVar1;
  UVector *this_00;
  void *size;
  UVector *local_60;
  UVector *values;
  UErrorCode *status_local;
  UObjectDeleter *valueDeleter_local;
  void *value_local;
  CharacterNode *this_local;
  
  size = value;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (this->fValues == (void *)0x0) {
      this->fValues = value;
    }
    else {
      if (this->fHasValuesVector == '\0') {
        this_00 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
        local_60 = (UVector *)0x0;
        if (this_00 != (UVector *)0x0) {
          UVector::UVector(this_00,valueDeleter,(UElementsAreEqual *)0x0,1,status);
          local_60 = this_00;
        }
        UVar1 = ::U_FAILURE(*status);
        if (UVar1 != '\0') {
          if (valueDeleter == (UObjectDeleter *)0x0) {
            return;
          }
          (*valueDeleter)(value);
          return;
        }
        UVector::addElement(local_60,this->fValues,status);
        this->fValues = local_60;
        this->fHasValuesVector = '\x01';
      }
      UVector::addElement((UVector *)this->fValues,value,status);
    }
  }
  else if (valueDeleter != (UObjectDeleter *)0x0) {
    (*valueDeleter)(value);
  }
  return;
}

Assistant:

void
CharacterNode::addValue(void *value, UObjectDeleter *valueDeleter, UErrorCode &status) {
    if (U_FAILURE(status)) {
        if (valueDeleter) {
            valueDeleter(value);
        }
        return;
    }
    if (fValues == NULL) {
        fValues = value;
    } else {
        // At least one value already.
        if (!fHasValuesVector) {
            // There is only one value so far, and not in a vector yet.
            // Create a vector and add the old value.
            UVector *values = new UVector(valueDeleter, NULL, DEFAULT_CHARACTERNODE_CAPACITY, status);
            if (U_FAILURE(status)) {
                if (valueDeleter) {
                    valueDeleter(value);
                }
                return;
            }
            values->addElement(fValues, status);
            fValues = values;
            fHasValuesVector = TRUE;
        }
        // Add the new value.
        ((UVector *)fValues)->addElement(value, status);
    }
}